

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<named_fstream,_std::default_delete<named_fstream>_>
memory::make_unique<named_fstream,char_const(&)[35]>(char (*args) [35])

{
  _Ios_Openmode _Var1;
  named_fstream *pnVar2;
  char *in_RSI;
  tuple<named_fstream_*,_std::default_delete<named_fstream>_> in_RDI;
  pointer in_stack_ffffffffffffff88;
  _Head_base<0UL,_named_fstream_*,_false> this;
  allocator local_31;
  string local_30 [32];
  char *local_10;
  
  this._M_head_impl =
       (named_fstream *)
       in_RDI.super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
       super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
  local_10 = in_RSI;
  pnVar2 = (named_fstream *)operator_new(0x248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,local_10,&local_31);
  _Var1 = std::operator|(_S_in,_S_out);
  _Var1 = std::operator|(_Var1,_S_trunc);
  _Var1 = std::operator|(_Var1,_S_bin);
  named_fstream::named_fstream(pnVar2,local_30,_Var1);
  std::unique_ptr<named_fstream,std::default_delete<named_fstream>>::
  unique_ptr<std::default_delete<named_fstream>,void>
            ((unique_ptr<named_fstream,_std::default_delete<named_fstream>_> *)this._M_head_impl,
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (__uniq_ptr_data<named_fstream,_std::default_delete<named_fstream>,_true,_true>)
         (__uniq_ptr_data<named_fstream,_std::default_delete<named_fstream>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
         super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
    {
        return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
    }